

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O2

void __thiscall
QFormLayout::getItemPosition(QFormLayout *this,int index,int *rowPtr,ItemRole *rolePtr)

{
  long lVar1;
  int iVar2;
  ItemRole IVar3;
  ItemRole IVar4;
  ItemRole IVar5;
  QFormLayoutItem *item;
  
  lVar1 = *(long *)&(this->super_QLayout).field_0x8;
  if ((ulong)(long)index < *(ulong *)(lVar1 + 0xe8)) {
    item = *(QFormLayoutItem **)(*(long *)(lVar1 + 0xe0) + (long)index * 8);
  }
  else {
    item = (QFormLayoutItem *)0x0;
  }
  iVar2 = storageIndexFromLayoutItem((ItemMatrix *)(lVar1 + 0xc0),item);
  if (iVar2 == -1) {
    IVar5 = ~LabelRole;
    IVar3 = IVar5;
  }
  else {
    IVar5 = iVar2 % 2;
    IVar3 = iVar2 / 2;
  }
  if (rowPtr != (int *)0x0) {
    *rowPtr = IVar3;
  }
  if ((rolePtr != (ItemRole *)0x0) && (IVar3 != ~LabelRole)) {
    if ((IVar5 != FieldRole) ||
       (IVar4 = SpanningRole,
       *(char *)(*(long *)(*(long *)(lVar1 + 200) + (long)(int)(IVar3 * 2 + 1) * 8) + 8) == '\0')) {
      IVar4 = IVar5;
    }
    *rolePtr = IVar4;
  }
  return;
}

Assistant:

void QFormLayout::getItemPosition(int index, int *rowPtr, ItemRole *rolePtr) const
{
    Q_D(const QFormLayout);
    int col = -1;
    int row = -1;

    const int storageIndex = storageIndexFromLayoutItem(d->m_matrix, d->m_things.value(index));
    if (storageIndex != -1)
        QFormLayoutPrivate::ItemMatrix::storageIndexToPosition(storageIndex, &row, &col);

    if (rowPtr)
        *rowPtr = row;
    if (rolePtr && row != -1) {
        const bool spanning = col == 1 && d->m_matrix(row, col)->fullRow;
        if (spanning) {
            *rolePtr = SpanningRole;
        } else {
            *rolePtr = ItemRole(col);
        }
    }
}